

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O0

bool __thiscall Sphere::intersect(Sphere *this,Ray *ray,Hit *h,float tmin)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  undefined8 *in_RDX;
  Vector3f *in_RSI;
  Vector3f *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  double dVar4;
  undefined1 auVar5 [64];
  float u;
  Vector3f norm;
  float t;
  float *__end1;
  float *__begin1;
  float (*__range1) [2];
  float s [2];
  float dt;
  float A;
  float B;
  float C;
  Vector3f p;
  Vector3f *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Vector3f *in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Vector3f *in_stack_ffffffffffffff78;
  Vector3f local_70;
  float local_64;
  float *local_60;
  float *local_58;
  float *local_50;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  Vector3f local_30;
  float local_24;
  undefined8 *local_20;
  Vector3f *local_18;
  undefined1 extraout_var [60];
  
  local_24 = in_XMM0_Da;
  local_20 = in_RDX;
  local_18 = in_RSI;
  ::operator-(in_stack_ffffffffffffff78,
              (Vector3f *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  auVar5._0_4_ = Vector3f::squaredLength(&local_30);
  auVar5._4_60_ = extraout_var;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_RDI[2].m_elements[0]),
                           ZEXT416((uint)-in_RDI[2].m_elements[0]),auVar5._0_16_);
  local_34 = auVar1._0_4_;
  local_38 = Vector3f::dot(in_RDI,(Vector3f *)
                                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_38 = local_38 * 2.0;
  local_3c = Vector3f::squaredLength(local_18 + 1);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_38),ZEXT416((uint)local_38),
                           ZEXT416((uint)-(local_3c * 4.0 * local_34)));
  local_40 = auVar1._0_4_;
  if (0.0 <= local_40) {
    dVar4 = std::sqrt((double)(ulong)(uint)local_40);
    local_40 = SUB84(dVar4,0);
    local_48 = (-local_38 - local_40) / (local_3c * 2.0);
    local_44 = (-local_38 + local_40) / (local_3c * 2.0);
    if (local_44 < local_48) {
      std::swap<float>(&local_48,&local_44);
    }
    local_60 = &local_40;
    local_50 = &local_48;
    for (local_58 = local_50; local_58 != local_60; local_58 = local_58 + 1) {
      local_64 = *local_58;
      if ((local_24 <= local_64) && (local_64 < *(float *)(local_20 + 1))) {
        ::operator*(in_stack_ffffffffffffff68,(float)((ulong)in_RDI >> 0x20));
        ::operator+(in_stack_ffffffffffffff78,
                    (Vector3f *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        ::operator-(in_stack_ffffffffffffff78,
                    (Vector3f *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        Vector3f::normalize(local_18);
        *(float *)(local_20 + 1) = local_64;
        *local_20 = in_RDI;
        Vector3f::operator=(local_18,in_stack_ffffffffffffff48);
        pfVar2 = Vector3f::operator[](&local_70,2);
        fVar3 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_70,0);
        fVar3 = atan2f(fVar3,*pfVar2);
        if (fVar3 < 0.0) {
          fVar3 = fVar3 + 6.2831855;
        }
        pfVar2 = Vector3f::operator[](&local_70,1);
        Vector2f::Vector2f((Vector2f *)&stack0xffffffffffffff6c,(-*pfVar2 + 1.0) / 2.0,
                           fVar3 / 6.2831855);
        Vector2f::operator=((Vector2f *)local_18,(Vector2f *)in_stack_ffffffffffffff48);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		Vector3f p = ray.o - o;
		float C = p.squaredLength() - r * r;
		float B = 2 * Vector3f::dot(p, ray.d);
		float A = ray.d.squaredLength();
		float dt = B * B - 4 * A * C;
		if (dt < 0) return 0;
		dt = sqrt(dt);
		float s[2] = { (-B - dt) / (2 * A),(-B + dt) / (2 * A) };
		if (s[0] > s[1]) std::swap(s[0], s[1]);
		for (float t : s)
		{
			if (t < tmin || t >= h.t) continue;
			Vector3f norm = ray.o + ray.d * t - o;
			norm.normalize();
			h.t = t; h.obj = this; h.norm = norm;
			float u = atan2f(norm[2], norm[0]);
			if (u < 0) u += PI * 2;
			h.pos = Vector2f((-norm[1] + 1) / 2, u / (PI * 2));
			return 1;
		}
		return 0;
	}